

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O3

void __thiscall MyClientConnection::OnConnect(MyClientConnection *this)

{
  string Hello;
  uint8_t hello [1401];
  undefined1 *local_5b8;
  long local_5b0;
  undefined1 local_5a8 [16];
  undefined1 local_598;
  undefined1 local_597 [1407];
  
  test::LogTonkStatus(&this->super_SDKConnection);
  memset(&local_598,0,0x579);
  local_598 = 5;
  local_5b8 = local_5a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"Hello World","");
  memcpy(local_597,local_5b8,local_5b0 + 1);
  test::FunctionTimer::BeginCall((FunctionTimer *)test::t_tonk_send);
  tonk::SDKConnection::Send(&this->super_SDKConnection,&local_598,local_5b0 + 2,0x32);
  test::FunctionTimer::EndCall((FunctionTimer *)test::t_tonk_send);
  if (local_5b8 != local_5a8) {
    operator_delete(local_5b8);
  }
  return;
}

Assistant:

void MyClientConnection::OnConnect()
{
    LogTonkStatus(this);

    uint8_t hello[1 + 1400] = {};
    hello[0] = ID_ConnectionRebroadcast;
    std::string Hello = "Hello World";
    memcpy(hello + 1, Hello.c_str(), Hello.length() + 1);
    t_tonk_send.BeginCall();
    Send(hello, 1 + Hello.length() + 1, TonkChannel_Reliable0);
    t_tonk_send.EndCall();
}